

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall clinet::on_accept(clinet *this,int netid,int error)

{
  undefined1 local_38 [8];
  login_req req;
  int error_local;
  int netid_local;
  clinet *this_local;
  
  req.name._24_4_ = error;
  req.name._28_4_ = netid;
  if (error == 0) {
    this->netid_ = netid;
    printf(anon_var_dwarf_d0);
    memset(local_38,0,0x20);
    printf(anon_var_dwarf_e6);
    __isoc99_scanf("%s",local_38);
    send_message(this,1,local_38,0x20);
    return;
  }
  __assert_fail("error == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jinjiazhang[P]protonet/sample/client.cpp"
                ,0x17,"virtual void clinet::on_accept(int, int)");
}

Assistant:

void on_accept(int netid, int error) override
    {
        assert(error == 0);
        netid_ = netid;
        printf("连接服务器成功\n");

        login_req req = { 0 };
        printf("请先给自己起个名字：");
        scanf("%s", req.name);
        send_message(MSG_LOGIN_REQ, &req, sizeof(req));
    }